

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilBitMatrix.c
# Opt level: O1

int Extra_BitMatrixCountOnesUpper(Extra_BitMat_t *p)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar2 = (ulong)p->nSize;
  if (0 < (long)uVar2) {
    iVar1 = 0;
    uVar3 = 0;
    do {
      uVar4 = uVar3 + 1;
      if (uVar4 < uVar2) {
        uVar6 = uVar4 & 0xffffffff;
        do {
          iVar1 = iVar1 + (uint)((p->ppData[uVar3][uVar6 >> 5] >> ((uint)uVar6 & 0x1f) & 1) != 0);
          uVar5 = (uint)uVar6 + 1;
          uVar6 = (ulong)uVar5;
        } while (p->nSize != uVar5);
      }
      uVar3 = uVar4;
    } while (uVar4 != uVar2);
    return iVar1;
  }
  return 0;
}

Assistant:

int Extra_BitMatrixCountOnesUpper( Extra_BitMat_t * p )
{
    int i, k, nTotal = 0;
    for ( i = 0; i < p->nSize; i++ )
        for ( k = i + 1; k < p->nSize; k++ )
            nTotal += ( (p->ppData[i][k>>5] & (1 << (k&31))) > 0 );
    return nTotal;
}